

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppression.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::NonMaximumSuppression_PickTop::SerializeWithCachedSizes
          (NonMaximumSuppression_PickTop *this,CodedOutputStream *output)

{
  bool bVar1;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  NonMaximumSuppression_PickTop *this_local;
  
  bVar1 = perclass(this);
  if (bVar1) {
    bVar1 = perclass(this);
    google::protobuf::internal::WireFormatLite::WriteBool(1,bVar1,output);
  }
  return;
}

Assistant:

void NonMaximumSuppression_PickTop::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.NonMaximumSuppression.PickTop)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // bool perClass = 1;
  if (this->perclass() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(1, this->perclass(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.NonMaximumSuppression.PickTop)
}